

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O0

SRes Lzma2Decode(Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,Byte prop,
                ELzmaFinishMode finishMode,ELzmaStatus *status,ISzAlloc *alloc)

{
  SRes SVar1;
  undefined8 *in_RCX;
  undefined8 *in_RSI;
  int __result__;
  SizeT inSize;
  SizeT outSize;
  SRes res;
  CLzma2Dec p;
  undefined4 in_stack_ffffffffffffff08;
  CLzmaDec *p_00;
  ISzAlloc *alloc_00;
  undefined4 in_stack_ffffffffffffff24;
  CLzma2Dec *in_stack_ffffffffffffff28;
  ELzmaStatus *in_stack_ffffffffffffff50;
  undefined4 local_a8;
  ELzmaFinishMode in_stack_ffffffffffffff5c;
  Byte *in_stack_ffffffffffffff68;
  SizeT in_stack_ffffffffffffff70;
  CLzma2Dec *in_stack_ffffffffffffff78;
  SRes local_4;
  
  alloc_00 = (ISzAlloc *)*in_RSI;
  p_00 = (CLzmaDec *)*in_RCX;
  *in_RCX = 0;
  *in_RSI = 0;
  *(undefined4 *)inSize = 0;
  local_4 = Lzma2Dec_AllocateProbs
                      (in_stack_ffffffffffffff28,(Byte)((uint)in_stack_ffffffffffffff24 >> 0x18),
                       alloc_00);
  if (local_4 == 0) {
    Lzma2Dec_Init((CLzma2Dec *)0x89882f);
    *in_RCX = p_00;
    SVar1 = Lzma2Dec_DecodeToDic
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                       ,(SizeT *)alloc_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
    *in_RSI = CONCAT44(in_stack_ffffffffffffff5c,local_a8);
    if ((SVar1 == 0) && (*(int *)inSize == 3)) {
      SVar1 = 6;
    }
    LzmaDec_FreeProbs(p_00,(ISzAlloc *)CONCAT44(local_4,in_stack_ffffffffffffff08));
    local_4 = SVar1;
  }
  return local_4;
}

Assistant:

SRes Lzma2Decode(Byte *dest, SizeT *destLen, const Byte *src, SizeT *srcLen,
    Byte prop, ELzmaFinishMode finishMode, ELzmaStatus *status, ISzAlloc *alloc)
{
  CLzma2Dec p;
  SRes res;
  SizeT outSize = *destLen, inSize = *srcLen;
  *destLen = *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  Lzma2Dec_Construct(&p);
  RINOK(Lzma2Dec_AllocateProbs(&p, prop, alloc));
  p.decoder.dic = dest;
  p.decoder.dicBufSize = outSize;
  Lzma2Dec_Init(&p);
  *srcLen = inSize;
  res = Lzma2Dec_DecodeToDic(&p, outSize, src, srcLen, finishMode, status);
  *destLen = p.decoder.dicPos;
  if (res == SZ_OK && *status == LZMA_STATUS_NEEDS_MORE_INPUT)
    res = SZ_ERROR_INPUT_EOF;
  Lzma2Dec_FreeProbs(&p, alloc);
  return res;
}